

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O2

CloningFilter * __thiscall
helics::ConnectorFederateManager::registerCloningFilter
          (ConnectorFederateManager *this,string_view name,string_view type_in,string_view type_out)

{
  _Head_base<0UL,_helics::CloningFilter_*,_false> _Var1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  RegistrationFailure *this_00;
  char *pcVar4;
  size_t sVar5;
  string_view searchValue;
  string_view message;
  InterfaceHandle handle;
  _Head_base<0UL,_helics::CloningFilter_*,_false> local_48;
  string_view name_local;
  handle filts;
  
  name_local._M_str = name._M_str;
  name_local._M_len = name._M_len;
  uVar2 = (*this->coreObject->_vptr_Core[0x3a])();
  if (uVar2 == 0x9aac0f00) {
    this_00 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
    message._M_str = "Unable to register Filter";
    message._M_len = 0x19;
    RegistrationFailure::RegistrationFailure(this_00,message);
    __cxa_throw(this_00,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
  }
  std::
  make_unique<helics::CloningFilter,helics::Federate*&,std::basic_string_view<char,std::char_traits<char>>&,helics::InterfaceHandle&>
            ((Federate **)&local_48,(basic_string_view<char,_std::char_traits<char>_> *)&this->fed,
             (InterfaceHandle *)&name_local);
  _Var1._M_head_impl = local_48._M_head_impl;
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock(&filts,&this->filters);
  pcVar4 = name_local._M_str;
  sVar5 = name_local._M_len;
  if (name_local._M_len == 0) {
    iVar3 = (*this->coreObject->_vptr_Core[0x28])(this->coreObject,(ulong)uVar2);
    pcVar4 = *(char **)CONCAT44(extraout_var,iVar3);
    sVar5 = ((undefined8 *)CONCAT44(extraout_var,iVar3))[1];
  }
  searchValue._M_str = pcVar4;
  searchValue._M_len = sVar5;
  gmlc::containers::
  StringMappedVector<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,(reference_stability)0,5>
  ::insert<std::unique_ptr<helics::CloningFilter,std::default_delete<helics::CloningFilter>>>
            ((StringMappedVector<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,(reference_stability)0,5>
              *)filts.data,searchValue,
             (unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_> *)
             &local_48);
  std::unique_lock<std::shared_mutex>::~unique_lock(&filts.m_handle_lock);
  if (local_48._M_head_impl != (CloningFilter *)0x0) {
    (*((local_48._M_head_impl)->super_Filter).super_Interface._vptr_Interface[1])();
  }
  return _Var1._M_head_impl;
}

Assistant:

CloningFilter& ConnectorFederateManager::registerCloningFilter(std::string_view name,
                                                               std::string_view type_in,
                                                               std::string_view type_out)
{
    auto handle = coreObject->registerCloningFilter(name, type_in, type_out);
    if (handle.isValid()) {
        auto filtPtr = std::make_unique<CloningFilter>(fed, name, handle);
        CloningFilter& filt = *filtPtr;
        auto filts = filters.lock();
        if (name.empty()) {
            filts->insert(coreObject->getHandleName(handle), std::move(filtPtr));
        } else {
            filts->insert(name, std::move(filtPtr));
        }
        return filt;
    }
    throw(RegistrationFailure("Unable to register Filter"));
}